

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  char *mode;
  char *verb;
  char *prog;
  bool testmode;
  allocator<char> local_8a;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  PersistenceTest test;
  
  testmode = false;
  if (argc == 3) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&test,argv[1],&local_8a);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &test,"-v");
    bVar1 = true;
    if (!bVar2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,argv[2],&local_89);
      bVar1 = std::operator==(&local_88,"-v");
      std::__cxx11::string::~string((string *)&local_88);
    }
    std::__cxx11::string::~string((string *)&test);
    std::__cxx11::string::string<std::allocator<char>>((string *)&test,argv[1],&local_8a);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &test,"-t");
    if (bVar2) {
      testmode = true;
      bVar2 = true;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,argv[2],&local_89);
      bVar2 = std::operator==(&local_88,"-t");
      testmode = bVar2;
      std::__cxx11::string::~string((string *)&local_88);
    }
LAB_001039d7:
    std::__cxx11::string::~string((string *)&test);
    prog = *argv;
    if (bVar1 != false) {
      verb = "ON";
      bVar1 = true;
      goto LAB_001039f8;
    }
  }
  else {
    if (argc == 2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&test,argv[1],(allocator<char> *)&local_88);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &test,"-v");
      std::__cxx11::string::~string((string *)&test);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&test,argv[1],(allocator<char> *)&local_88);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &test,"-t");
      testmode = bVar2;
      goto LAB_001039d7;
    }
    if (3 < argc) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Too many arguments.");
      std::endl<char,std::char_traits<char>>(poVar3);
      usage(*argv,"OFF","Preparation Mode");
      exit(-1);
    }
    prog = *argv;
    bVar2 = false;
  }
  verb = "OFF";
  bVar1 = false;
LAB_001039f8:
  mode = "Preparation Mode";
  if (bVar2 != false) {
    mode = "Test Mode";
  }
  usage(prog,verb,mode);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"./data",&local_8a);
  PersistenceTest::PersistenceTest(&test,&local_88,bVar1);
  std::__cxx11::string::~string((string *)&local_88);
  PersistenceTest::start_test(&test,&testmode);
  Test::~Test(&test.super_Test);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    bool verbose = false;
    bool testmode = false;

    if (argc == 2) {
        verbose = std::string(argv[1]) == "-v";
        testmode = std::string(argv[1]) == "-t";
    } else if (argc == 3) {
        verbose = std::string(argv[1]) == "-v" ||
                  std::string(argv[2]) == "-v";
        testmode = std::string(argv[1]) == "-t" ||
                   std::string(argv[2]) == "-t";
    } else if (argc > 3) {
        std::cerr << "Too many arguments." << std::endl;
        usage(argv[0], "OFF", "Preparation Mode");
        exit(-1);
    }
    usage(argv[0], verbose ? "ON" : "OFF",
          testmode ? "Test Mode" : "Preparation Mode");

    PersistenceTest test("./data", verbose);

    test.start_test(static_cast<void *>(&testmode));

    return 0;
}